

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::CallDebugHook(SQVM *this,SQInteger type,SQInteger forcedline)

{
  SQFunctionProto *this_00;
  SQDEBUGHOOK p_Var1;
  _HashNode **pp_Var2;
  _HashNode **pp_Var3;
  SQObjectPtr local_50;
  SQObjectPtr temp_reg;
  
  this->_debughook = false;
  p_Var1 = this->_debughook_native;
  this_00 = ((this->ci->_closure).super_SQObject._unVal.pClosure)->_function;
  if (p_Var1 == (SQDEBUGHOOK)0x0) {
    temp_reg.super_SQObject._type = OT_NULL;
    temp_reg.super_SQObject._unVal.pTable = (SQTable *)0x0;
    Push(this,&this->_roottable);
    local_50.super_SQObject._type = OT_INTEGER;
    local_50.super_SQObject._unVal.nInteger = type;
    Push(this,&local_50);
    SQObjectPtr::~SQObjectPtr(&local_50);
    Push(this,&this_00->_sourcename);
    if (forcedline == 0) {
      forcedline = SQFunctionProto::GetLine(this_00,this->ci->_ip);
    }
    local_50.super_SQObject._type = OT_INTEGER;
    local_50.super_SQObject._unVal.nInteger = forcedline;
    Push(this,&local_50);
    SQObjectPtr::~SQObjectPtr(&local_50);
    Push(this,&this_00->_name);
    Call(this,&this->_debughook_closure,5,this->_top + -5,&temp_reg,0);
    Pop(this,5);
    SQObjectPtr::~SQObjectPtr(&temp_reg);
  }
  else {
    if ((this_00->_sourcename).super_SQObject._type == OT_STRING) {
      pp_Var3 = &((this_00->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
    }
    else {
      pp_Var3 = (_HashNode **)0x0;
    }
    if ((this_00->_name).super_SQObject._type == OT_STRING) {
      pp_Var2 = &((this_00->_name).super_SQObject._unVal.pTable)->_firstfree;
    }
    else {
      pp_Var2 = (_HashNode **)0x0;
    }
    if (forcedline == 0) {
      forcedline = SQFunctionProto::GetLine(this_00,this->ci->_ip);
      p_Var1 = this->_debughook_native;
    }
    (*p_Var1)(this,type,(SQChar *)pp_Var3,forcedline,(SQChar *)pp_Var2);
  }
  this->_debughook = true;
  return;
}

Assistant:

void SQVM::CallDebugHook(SQInteger type,SQInteger forcedline)
{
    _debughook = false;
    SQFunctionProto *func=_closure(ci->_closure)->_function;
    if(_debughook_native) {
        const SQChar *src = type(func->_sourcename) == OT_STRING?_stringval(func->_sourcename):NULL;
        const SQChar *fname = type(func->_name) == OT_STRING?_stringval(func->_name):NULL;
        SQInteger line = forcedline?forcedline:func->GetLine(ci->_ip);
        _debughook_native(this,type,src,line,fname);
    }
    else {
        SQObjectPtr temp_reg;
        SQInteger nparams=5;
        Push(_roottable); Push(type); Push(func->_sourcename); Push(forcedline?forcedline:func->GetLine(ci->_ip)); Push(func->_name);
        Call(_debughook_closure,nparams,_top-nparams,temp_reg,SQFalse);
        Pop(nparams);
    }
    _debughook = true;
}